

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::MakeLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,RelativeRoot relative)

{
  string *source;
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  string output;
  string local_138;
  RuleVariables local_118;
  
  std::__cxx11::string::string((string *)&local_118,"RULE_LAUNCH_CUSTOM",(allocator *)&output);
  pcVar1 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)this,target,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_118);
  }
  else {
    memset(&local_118.TargetPDB,0,0xe0);
    local_118.RuleLauncher = "RULE_LAUNCH_CUSTOM";
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    local_118.CMTarget = target;
    pvVar2 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    source = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (source != (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      cmOutputConverter::Convert
                (&local_138,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,relative,SHELL);
      std::__cxx11::string::operator=((string *)&output,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
    }
    local_118.Output = output._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cmLocalGenerator::ExpandRuleVariables
              ((cmLocalGenerator *)this,__return_storage_ptr__,&local_118);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&output);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmLocalUnixMakefileGenerator3::MakeLauncher(
  cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, RelativeRoot relative)
{
  // Short-circuit if there is no launcher.
  const char* prop = "RULE_LAUNCH_CUSTOM";
  const char* val = this->GetRuleLauncher(target, prop);
  if(!(val && *val))
    {
    return "";
    }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  RuleVariables vars;
  vars.RuleLauncher = prop;
  vars.CMTarget = target;
  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if(!outputs.empty())
    {
    output = this->Convert(outputs[0], relative, SHELL);
    }
  vars.Output = output.c_str();

  std::string launcher;
  this->ExpandRuleVariables(launcher, vars);
  if(!launcher.empty())
    {
    launcher += " ";
    }
  return launcher;
}